

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall
QFutureInterfaceBasePrivate::connectOutputInterface
          (QFutureInterfaceBasePrivate *this,QFutureCallOutInterface *iface)

{
  undefined4 uVar1;
  undefined4 uVar2;
  __pointer_type copy;
  uint uVar3;
  ProgressData *pPVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  ResultIteratorBase RVar8;
  QFutureCallOutEvent local_80;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar7 = (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar7) {
      (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar7) goto LAB_003ce310;
  }
  else {
LAB_003ce310:
    QBasicMutex::lockInternal((QBasicMutex *)this);
  }
  uVar3 = (this->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((uVar3 & 2) != 0) {
    QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
    local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_80.callOutType = Started;
    local_80.index1 = -1;
    local_80.index2 = -1;
    local_80.text.d.d = (Data *)0x0;
    local_80.text.d.ptr = (char16_t *)0x0;
    local_80.text.d.size = 0;
    (*iface->_vptr_QFutureCallOutInterface[2])();
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
    pPVar4 = (this->m_progress).d;
    if (pPVar4 == (ProgressData *)0x0) {
      QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
      local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
      local_80.callOutType = ProgressRange;
      local_80.index1 = 0;
      local_80.index2 = 0;
      local_80.text.d.d = (Data *)0x0;
      local_80.text.d.ptr = (char16_t *)0x0;
      local_80.text.d.size = 0;
      (*iface->_vptr_QFutureCallOutInterface[2])();
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
      iVar5 = this->m_progressValue;
      QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
      local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
      local_80.callOutType = Progress;
      local_80.index2 = -1;
      local_80.text.d.d = (Data *)0x0;
      local_80.text.d.ptr = (char16_t *)0x0;
      local_80.text.d.size = 0;
      local_80.index1 = iVar5;
      (*iface->_vptr_QFutureCallOutInterface[2])();
    }
    else {
      uVar1 = pPVar4->minimum;
      uVar2 = pPVar4->maximum;
      QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
      local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
      local_80.callOutType = ProgressRange;
      local_80.text.d.d = (Data *)0x0;
      local_80.text.d.ptr = (char16_t *)0x0;
      local_80.text.d.size = 0;
      local_80.index1 = uVar1;
      local_80.index2 = uVar2;
      (*iface->_vptr_QFutureCallOutInterface[2])();
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
      QFutureCallOutEvent::QFutureCallOutEvent
                (&local_80,Progress,this->m_progressValue,&((this->m_progress).d)->text);
      (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_80);
    }
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
  }
  if (this->hasException == false) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    RVar8 = QtPrivate::ResultStoreBase::begin(&(this->data).m_results);
    local_48._0_8_ = RVar8.mapIterator.i._M_node;
    local_48._8_4_ = RVar8.m_vectorIndex;
    while ((RVar8 = QtPrivate::ResultStoreBase::end(&(this->data).m_results),
           (const_iterator)local_48._0_8_ != RVar8.mapIterator.i._M_node.i ||
           (local_48._8_4_ != RVar8.m_vectorIndex))) {
      iVar5 = QtPrivate::ResultIteratorBase::resultIndex((ResultIteratorBase *)local_48);
      iVar6 = QtPrivate::ResultIteratorBase::batchSize((ResultIteratorBase *)local_48);
      QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
      local_80.index2 = iVar6 + iVar5;
      local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
      local_80.callOutType = ResultsReady;
      local_80.text.d.d = (Data *)0x0;
      local_80.text.d.ptr = (char16_t *)0x0;
      local_80.text.d.size = 0;
      local_80.index1 = iVar5;
      (*iface->_vptr_QFutureCallOutInterface[2])(iface,&local_80);
      QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
      QtPrivate::ResultIteratorBase::batchedAdvance((ResultIteratorBase *)local_48);
    }
  }
  if ((uVar3 & 0x20) == 0) {
    if ((uVar3 & 0x10) == 0) goto LAB_003ce668;
    QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
    local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_80.callOutType = Suspending;
    local_80.index1 = -1;
    local_80.index2 = -1;
    local_80.text.d.d = (Data *)0x0;
    local_80.text.d.ptr = (char16_t *)0x0;
    local_80.text.d.size = 0;
    (*iface->_vptr_QFutureCallOutInterface[2])();
  }
  else {
    QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
    local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_80.callOutType = Suspended;
    local_80.index1 = -1;
    local_80.index2 = -1;
    local_80.text.d.d = (Data *)0x0;
    local_80.text.d.ptr = (char16_t *)0x0;
    local_80.text.d.size = 0;
    (*iface->_vptr_QFutureCallOutInterface[2])();
  }
  QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
LAB_003ce668:
  if ((uVar3 & 8) != 0) {
    QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
    local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_80.callOutType = Canceled;
    local_80.index1 = -1;
    local_80.index2 = -1;
    local_80.text.d.d = (Data *)0x0;
    local_80.text.d.ptr = (char16_t *)0x0;
    local_80.text.d.size = 0;
    (*iface->_vptr_QFutureCallOutInterface[2])();
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
  }
  if ((uVar3 & 4) != 0) {
    QEvent::QEvent(&local_80.super_QEvent,FutureCallOut);
    local_80.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_80.callOutType = Finished;
    local_80.index1 = -1;
    local_80.index2 = -1;
    local_80.text.d.d = (Data *)0x0;
    local_80.text.d.ptr = (char16_t *)0x0;
    local_80.text.d.size = 0;
    (*iface->_vptr_QFutureCallOutInterface[2])();
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_80);
  }
  local_80.super_QEvent._vptr_QEvent = (_func_int **)iface;
  QtPrivate::QPodArrayOps<QFutureCallOutInterface*>::emplace<QFutureCallOutInterface*&>
            ((QPodArrayOps<QFutureCallOutInterface*> *)&this->outputConnections,
             (this->outputConnections).d.size,(QFutureCallOutInterface **)&local_80);
  QList<QFutureCallOutInterface_*>::end(&this->outputConnections);
  LOCK();
  copy = (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBasePrivate::connectOutputInterface(QFutureCallOutInterface *iface)
{
    QMutexLocker locker(&m_mutex);

    const auto currentState = state.loadRelaxed();
    if (currentState & QFutureInterfaceBase::Started) {
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Started));
        if (m_progress) {
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange,
                                                        m_progress->minimum,
                                                        m_progress->maximum));
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                                        m_progressValue,
                                                        m_progress->text));
        } else {
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ProgressRange,
                                                        0,
                                                        0));
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Progress,
                                                        m_progressValue,
                                                        QString()));
        }
    }

    if (!hasException) {
        QtPrivate::ResultIteratorBase it = data.m_results.begin();
        while (it != data.m_results.end()) {
            const int begin = it.resultIndex();
            const int end = begin + it.batchSize();
            iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::ResultsReady,
                                                        begin,
                                                        end));
            it.batchedAdvance();
        }
    }

    if (currentState & QFutureInterfaceBase::Suspended)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Suspended));
    else if (currentState & QFutureInterfaceBase::Suspending)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Suspending));

    if (currentState & QFutureInterfaceBase::Canceled)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Canceled));

    if (currentState & QFutureInterfaceBase::Finished)
        iface->postCallOutEvent(QFutureCallOutEvent(QFutureCallOutEvent::Finished));

    outputConnections.append(iface);
}